

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall
cmComputeTargetDepends::AddTargetDepend
          (cmComputeTargetDepends *this,int depender_index,cmLinkItem *dependee_name,bool linking)

{
  cmGeneratorTarget *pcVar1;
  cmake *this_00;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  string *psVar6;
  PolicyID id;
  MessageType t;
  ostringstream e;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  pcVar1 = dependee_name->Target;
  if (pcVar1 != (cmGeneratorTarget *)0x0 || linking) {
    if (linking && pcVar1 != (cmGeneratorTarget *)0x0) {
      TVar3 = cmGeneratorTarget::GetType(pcVar1);
      if ((TVar3 == EXECUTABLE) &&
         (bVar2 = cmGeneratorTarget::IsExecutableWithExports(pcVar1), !bVar2)) {
        return;
      }
    }
    else if (pcVar1 == (cmGeneratorTarget *)0x0) {
      return;
    }
    AddTargetDepend(this,depender_index,pcVar1,&dependee_name->Backtrace,linking);
    return;
  }
  pcVar1 = (this->Targets).
           super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
           ._M_impl.super__Vector_impl_data._M_start[depender_index];
  TVar3 = cmGeneratorTarget::GetType(pcVar1);
  if (TVar3 == GLOBAL_TARGET) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  PVar4 = cmPolicies::PolicyMap::Get(&pcVar1->PolicyMap,CMP0046);
  t = FATAL_ERROR;
  if (2 < PVar4 - NEW) {
    if (PVar4 != WARN) goto LAB_003a6c19;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c0,(cmPolicies *)0x2e,id);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    t = AUTHOR_WARNING;
  }
  this_00 = this->GlobalGenerator->CMakeInstance;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"The dependency target \"",0x17);
  poVar5 = operator<<((ostream *)local_1a0,dependee_name);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" of target \"",0xd);
  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" does not exist.",0x11);
  std::__cxx11::stringbuf::str();
  cmake::IssueMessage(this_00,t,&local_1c0,&dependee_name->Backtrace);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
LAB_003a6c19:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return;
}

Assistant:

void cmComputeTargetDepends::AddTargetDepend(int depender_index,
                                             cmLinkItem const& dependee_name,
                                             bool linking)
{
  // Get the depender.
  cmGeneratorTarget const* depender = this->Targets[depender_index];

  // Check the target's makefile first.
  cmGeneratorTarget const* dependee = dependee_name.Target;

  if (!dependee && !linking &&
      (depender->GetType() != cmStateEnums::GLOBAL_TARGET)) {
    MessageType messageType = MessageType::AUTHOR_WARNING;
    bool issueMessage = false;
    std::ostringstream e;
    switch (depender->GetPolicyStatusCMP0046()) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0046) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = MessageType::FATAL_ERROR;
    }
    if (issueMessage) {
      cmake* cm = this->GlobalGenerator->GetCMakeInstance();

      e << "The dependency target \"" << dependee_name << "\" of target \""
        << depender->GetName() << "\" does not exist.";

      cm->IssueMessage(messageType, e.str(), dependee_name.Backtrace);
    }
  }

  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if (linking && dependee && dependee->GetType() == cmStateEnums::EXECUTABLE &&
      !dependee->IsExecutableWithExports()) {
    dependee = nullptr;
  }

  if (dependee) {
    this->AddTargetDepend(depender_index, dependee, dependee_name.Backtrace,
                          linking);
  }
}